

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

bool __thiscall
node::anon_unknown_2::ChainImpl::findAncestorByHeight
          (ChainImpl *this,uint256 *block_hash,int ancestor_height,FoundBlock *ancestor_out)

{
  bool bVar1;
  ChainstateManager *pCVar2;
  Chainstate *pCVar3;
  CBlockIndex *pCVar4;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> lock;
  unique_lock<std::recursive_mutex> local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_40,&cs_main,"cs_main",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp"
             ,0x25b,false);
  pCVar2 = chainman(this);
  pCVar3 = ChainstateManager::ActiveChainstate(pCVar2);
  pCVar2 = chainman(this);
  pCVar4 = BlockManager::LookupBlockIndex(&pCVar2->m_blockman,block_hash);
  if (pCVar4 != (CBlockIndex *)0x0) {
    pCVar4 = CBlockIndex::GetAncestor(pCVar4,ancestor_height);
    if (pCVar4 != (CBlockIndex *)0x0) {
      pCVar2 = chainman(this);
      bVar1 = FillBlock(pCVar4,ancestor_out,
                        (UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_40,
                        &pCVar3->m_chain,&pCVar2->m_blockman);
      goto LAB_0022c408;
    }
  }
  chainman(this);
  bVar1 = false;
LAB_0022c408:
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool findAncestorByHeight(const uint256& block_hash, int ancestor_height, const FoundBlock& ancestor_out) override
    {
        WAIT_LOCK(cs_main, lock);
        const CChain& active = chainman().ActiveChain();
        if (const CBlockIndex* block = chainman().m_blockman.LookupBlockIndex(block_hash)) {
            if (const CBlockIndex* ancestor = block->GetAncestor(ancestor_height)) {
                return FillBlock(ancestor, ancestor_out, lock, active, chainman().m_blockman);
            }
        }
        return FillBlock(nullptr, ancestor_out, lock, active, chainman().m_blockman);
    }